

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upd7759.c
# Opt level: O1

UINT8 device_start_upd7759(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  uint uVar1;
  upd7759_state *chip;
  DEV_DATA DVar2;
  UINT8 UVar3;
  
  DVar2.chipInf = calloc(1,0xa8);
  if (DVar2.chipInf == (void *)0x0) {
    UVar3 = 0xff;
  }
  else {
    UVar3 = cfg->flags;
    *(UINT8 *)&((DEV_DATA *)((long)DVar2.chipInf + 0x60))->chipInf = UVar3;
    *(undefined1 *)&((DEV_DATA *)((long)DVar2.chipInf + 8))->chipInf = 1;
    *(undefined4 *)&((DEV_DATA *)((long)DVar2.chipInf + 0x10))->chipInf = 0x400000;
    *(undefined1 *)&((DEV_DATA *)((long)DVar2.chipInf + 0x20))->chipInf = 0;
    *(undefined8 *)((long)DVar2.chipInf + 0x44) = 0;
    *(undefined8 *)((long)DVar2.chipInf + 0x4c) = 0;
    *(undefined8 *)((long)DVar2.chipInf + 0x54) = 0;
    if (UVar3 != '\0') {
      *(undefined4 *)((long)DVar2.chipInf + 0x5c) = 0;
    }
    UVar3 = '\0';
    ((DEV_DATA *)((long)DVar2.chipInf + 0x18))->chipInf = (void *)0x0;
    *(undefined2 *)((long)DVar2.chipInf + 0x15) = 0x101;
    *(undefined1 *)((long)DVar2.chipInf + 0x61) = 0;
    *(void **)DVar2.chipInf = DVar2.chipInf;
    uVar1 = cfg->clock;
    retDevInf->dataPtr = (DEV_DATA *)DVar2.chipInf;
    retDevInf->sampleRate = uVar1 >> 2;
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  }
  return UVar3;
}

Assistant:

static UINT8 device_start_upd7759(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	upd7759_state *chip;

	chip = (upd7759_state *)calloc(1, sizeof(upd7759_state));
	if (chip == NULL)
		return 0xFF;

	chip->ChipMode = cfg->flags;

	/* chip configuration */
	//chip->sample_offset_shift = (type() == UPD7759) ? 1 : 0;
	chip->sample_offset_shift = 1;

	/* compute the stepping rate based on the chip's clock speed */
	chip->step = 4 * FRAC_ONE;

	/* compute the clock period */
	//chip->clock_period = attotime::from_hz(clock());

	/* set the intial state */
	chip->state = STATE_IDLE;

	/* compute the ROM base or allocate a timer */
	chip->romoffset = 0x00;
	chip->romsize = 0x00;
	chip->rom = chip->rombase = NULL;
	if (chip->ChipMode)
	{
		//assert(type() == UPD7759); // other chips do not support slave mode
		//chip->timer = timer_alloc(TIMER_SLAVE_UPDATE);
		chip->rommask = 0;
	}

	/* set the DRQ callback */
	chip->drqcallback = NULL;

	/* assume /RESET and /START are both high */
	chip->reset = 1;
	chip->start = 1;

	/* toggle the reset line to finish the reset */
	//upd7759_reset(chip);

	upd7759_set_mute_mask(chip, 0x00);

	chip->_devData.chipInf = chip;
	INIT_DEVINF(retDevInf, &chip->_devData, cfg->clock / 4, &devDef);
	return 0x00;
}